

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall xray_re::xr_vbuf::xr_vbuf(xr_vbuf *this)

{
  xr_vbuf *this_local;
  
  xr_flexbuf::xr_flexbuf(&this->super_xr_flexbuf);
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_vbuf_0038c748;
  this->m_signature = 0;
  this->m_points = (fvector3 *)0x0;
  this->m_normals = (fvector3 *)0x0;
  this->m_texcoords = (fvector2 *)0x0;
  this->m_lightmaps = (fvector2 *)0x0;
  this->m_influences = (finfluence *)0x0;
  this->m_colors = (fcolor *)0x0;
  return;
}

Assistant:

xr_vbuf::xr_vbuf(): m_signature(0),
	m_points(0), m_normals(0),
	m_texcoords(0), m_lightmaps(0),
	m_influences(0), m_colors(0) {}